

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  Curl_easy *pCVar1;
  char *first;
  bool bVar2;
  Curl_send_buffer *pCVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  CURLcode CVar8;
  byte *pbVar9;
  byte *pbVar10;
  Curl_easy *pCVar11;
  byte *pbVar12;
  Curl_easy *second;
  undefined7 in_register_00000031;
  connectdata *pcVar13;
  curl_slist *h [2];
  CURLcode local_74;
  long local_70;
  Curl_send_buffer *local_60;
  connectdata *local_58;
  curl_slist *local_50;
  connectdata *local_40;
  long local_38;
  
  uVar6 = 2;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    uVar6 = *(uint *)&(conn->bits).field_0x4;
    uVar6 = (uint)(-1 < (short)uVar6) & uVar6 >> 6;
  }
  pCVar1 = conn->data;
  if (uVar6 == 2) {
    if (((pCVar1->set).field_0x8e8 & 0x10) == 0) goto LAB_00112cc4;
    local_58 = (connectdata *)(pCVar1->set).proxyheaders;
  }
  else {
    if (uVar6 == 1) {
      local_58 = (connectdata *)(pCVar1->set).headers;
      local_70 = 1;
      if (((pCVar1->set).field_0x8e8 & 0x10) != 0) {
        local_50 = (pCVar1->set).proxyheaders;
        local_70 = 2;
      }
      goto LAB_00112ce3;
    }
LAB_00112cc4:
    local_58 = (connectdata *)(pCVar1->set).headers;
  }
  local_70 = 1;
LAB_00112ce3:
  local_38 = 0;
  local_40 = conn;
  local_60 = req_buffer;
  do {
    pcVar13 = (&local_58)[local_38];
    while (pcVar13 != (connectdata *)0x0) {
      pCVar11 = pcVar13->data;
      pbVar9 = (byte *)strchr((char *)pCVar11,0x3a);
      if (pbVar9 == (byte *)0x0) {
        pbVar10 = (byte *)strchr((char *)pCVar11,0x3b);
        bVar2 = true;
        pbVar4 = pbVar10;
        pbVar5 = pbVar10;
        if (pbVar10 == (byte *)0x0) {
LAB_00112d68:
          pbVar10 = (byte *)0x0;
LAB_00112d6b:
          pbVar9 = pbVar10;
          pCVar11 = (Curl_easy *)0x0;
        }
        else {
          do {
            pbVar9 = pbVar5;
            pbVar12 = pbVar4;
            if (pbVar9[1] == 0) break;
            iVar7 = Curl_isspace((uint)pbVar9[1]);
            pbVar4 = pbVar12 + 1;
            pbVar5 = pbVar9 + 1;
          } while (iVar7 != 0);
          if (pbVar9[1] != 0) goto LAB_00112d68;
          if (*pbVar9 != 0x3b) goto LAB_00112d6b;
          pCVar11 = (Curl_easy *)(*Curl_cstrdup)((char *)pcVar13->data);
          pCVar3 = local_60;
          if (pCVar11 == (Curl_easy *)0x0) {
            if (local_60 != (Curl_send_buffer *)0x0) {
              (*Curl_cfree)(local_60->buffer);
              (*Curl_cfree)(pCVar3);
            }
            local_60 = (Curl_send_buffer *)0x0;
            local_74 = CURLE_OUT_OF_MEMORY;
            pCVar11 = (Curl_easy *)0x0;
            bVar2 = false;
          }
          else {
            pbVar12[(long)pCVar11 - (long)pcVar13->data] = 0x3a;
            pbVar9 = pbVar12 + ((long)pCVar11 - (long)pcVar13->data);
          }
        }
        conn = local_40;
        if (bVar2) goto LAB_00112d7c;
        bVar2 = false;
      }
      else {
        pCVar11 = (Curl_easy *)0x0;
LAB_00112d7c:
        if (pbVar9 != (byte *)0x0) {
          do {
            pbVar9 = pbVar9 + 1;
            if (*pbVar9 == 0) break;
            iVar7 = Curl_isspace((uint)*pbVar9);
          } while (iVar7 != 0);
          if ((pCVar11 != (Curl_easy *)0x0) || (*pbVar9 != 0)) {
            second = pCVar11;
            if (pCVar11 == (Curl_easy *)0x0) {
              second = pcVar13->data;
            }
            if ((((((conn->allocptr).host == (char *)0x0) ||
                  (iVar7 = curl_strnequal("Host:",(char *)second,5), iVar7 == 0)) &&
                 (((pCVar1->set).httpreq != HTTPREQ_POST_FORM ||
                  (iVar7 = curl_strnequal("Content-Type:",(char *)second,0xd), iVar7 == 0)))) &&
                ((((pCVar1->set).httpreq != HTTPREQ_POST_MIME ||
                  (iVar7 = curl_strnequal("Content-Type:",(char *)second,0xd), iVar7 == 0)) &&
                 ((((conn->bits).field_0x6 & 1) == 0 ||
                  (iVar7 = curl_strnequal("Content-Length:",(char *)second,0xf), iVar7 == 0)))))) &&
               (((((conn->allocptr).te == (char *)0x0 ||
                  (iVar7 = curl_strnequal("Connection:",(char *)second,0xb), iVar7 == 0)) &&
                 ((conn->httpversion < 0x14 ||
                  (iVar7 = curl_strnequal("Transfer-Encoding:",(char *)second,0x12), iVar7 == 0))))
                && (((((iVar7 = curl_strnequal("Authorization:",(char *)second,0xe), iVar7 == 0 &&
                       (iVar7 = curl_strnequal("Cookie:",(char *)second,7), iVar7 == 0)) ||
                      (((pCVar1->state).field_0x514 & 2) == 0)) ||
                     ((first = (pCVar1->state).first_host, first == (char *)0x0 ||
                      (((pCVar1->set).field_0x8eb & 1) != 0)))) ||
                    (iVar7 = Curl_strcasecompare(first,(conn->host).name), iVar7 != 0)))))) {
              CVar8 = Curl_add_bufferf(&local_60,"%s\r\n",second);
            }
            else {
              CVar8 = CURLE_OK;
            }
            if (pCVar11 != (Curl_easy *)0x0) {
              (*Curl_cfree)(pCVar11);
            }
            if (CVar8 != CURLE_OK) {
              bVar2 = false;
              local_74 = CVar8;
              goto LAB_00112ed3;
            }
          }
        }
        pcVar13 = *(connectdata **)&pcVar13->cnnct;
        bVar2 = true;
      }
LAB_00112ed3:
      if (!bVar2) {
        return local_74;
      }
    }
    local_38 = local_38 + 1;
    if (local_38 == local_70) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
                Curl_add_buffer_free(&req_buffer);
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
            result = Curl_add_bufferf(&req_buffer, "%s\r\n", compare);
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}